

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Div_f64(w3Interp *this)

{
  double *pdVar1;
  double dVar2;
  double a;
  w3Interp *this_local;
  
  dVar2 = w3Stack::pop_f64(&this->super_w3Stack);
  pdVar1 = w3Stack::f64(&this->super_w3Stack);
  *pdVar1 = *pdVar1 / dVar2;
  return;
}

Assistant:

INTERP (Div_f64)
{
    const double a = pop_f64 ();
    f64 () /= a;
}